

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# association.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_weakValueAssociation_create
          (sysbvm_context_t *context,sysbvm_tuple_t key,sysbvm_tuple_t value)

{
  sysbvm_object_tuple_t *tuple;
  sysbvm_weakValueAssociation_t *result;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t key_local;
  sysbvm_context_t *context_local;
  
  tuple = sysbvm_context_allocatePointerTuple(context,(context->roots).weakValueAssociationType,2);
  sysbvm_tuple_markWeakObject((sysbvm_tuple_t)tuple);
  (tuple->field_1).pointers[0] = key;
  tuple[1].header.field_0.typePointer = value;
  return (sysbvm_tuple_t)tuple;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_weakValueAssociation_create(sysbvm_context_t *context, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    sysbvm_weakValueAssociation_t *result = (sysbvm_weakValueAssociation_t*)sysbvm_context_allocatePointerTuple(context, context->roots.weakValueAssociationType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_weakValueAssociation_t));
    sysbvm_tuple_markWeakObject((sysbvm_tuple_t)result);
    result->key = key;
    result->value = value;
    return (sysbvm_tuple_t)result;
}